

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool tinyusdz::tydra::anon_unknown_0::TryConvertFacevaryingToVertexInt<short>
               (vector<short,_std::allocator<short>_> *src,
               vector<short,_std::allocator<short>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices)

{
  mapped_type mVar1;
  pointer psVar2;
  ulong uVar3;
  pointer puVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  __node_base _Var7;
  uint uVar8;
  size_type __new_size;
  bool bVar9;
  bool bVar10;
  uint32_t vidx;
  unordered_map<unsigned_int,_short,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_short>_>_>
  vdata;
  uint local_7c;
  vector<short,_std::allocator<short>_> *local_78;
  vector<short,_std::allocator<short>_> *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_short>,_std::allocator<std::pair<const_unsigned_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (dst == (vector<short,_std::allocator<short>_> *)0x0) {
    bVar10 = false;
  }
  else {
    uVar3 = (long)(faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    bVar10 = false;
    if (((long)(src->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(src->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
               super__Vector_impl_data._M_start >> 1 == uVar3) && (2 < uVar3)) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      puVar4 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      bVar10 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_finish == puVar4;
      if (bVar10) {
        __new_size = 1;
      }
      else {
        uVar3 = 0;
        uVar8 = 0;
        local_78 = src;
        local_70 = dst;
        do {
          local_7c = puVar4[uVar3];
          if (uVar8 < local_7c) {
            uVar8 = local_7c;
          }
          sVar5 = ::std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_short>,_std::allocator<std::pair<const_unsigned_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count(&local_68,&local_7c);
          if (sVar5 == 0) {
            mVar1 = (local_78->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar3];
            pmVar6 = ::std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_short>,_std::allocator<std::pair<const_unsigned_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_short>,_std::allocator<std::pair<const_unsigned_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&local_68,&local_7c);
            *pmVar6 = mVar1;
          }
          else {
            pmVar6 = ::std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_short>,_std::allocator<std::pair<const_unsigned_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_short>,_std::allocator<std::pair<const_unsigned_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&local_68,&local_7c);
            if (*pmVar6 !=
                (local_78->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar3]) goto LAB_00387ae9;
          }
          uVar3 = uVar3 + 1;
          puVar4 = (faceVertexIndices->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          bVar9 = uVar3 < (ulong)((long)(faceVertexIndices->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)puVar4
                                 >> 2);
          bVar10 = !bVar9;
        } while (bVar9);
        __new_size = (size_type)(uVar8 + 1);
        dst = local_70;
      }
      ::std::vector<short,_std::allocator<short>_>::resize(dst,__new_size);
      memset((dst->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_start,0,__new_size * 2);
      if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        psVar2 = (dst->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        _Var7._M_nxt = local_68._M_before_begin._M_nxt;
        do {
          psVar2[*(uint *)&_Var7._M_nxt[1]._M_nxt] = *(short *)((long)&_Var7._M_nxt[1]._M_nxt + 4);
          _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt;
        } while (_Var7._M_nxt != (_Hash_node_base *)0x0);
      }
LAB_00387ae9:
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_short>,_std::allocator<std::pair<const_unsigned_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
    }
  }
  return bVar10;
}

Assistant:

bool TryConvertFacevaryingToVertexInt(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices) {
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i])) {
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}